

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O0

string * cxxflags_abi_cxx11_(bool internal)

{
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  int iVar1;
  mapped_type *pmVar2;
  ulong uVar3;
  byte in_SIL;
  string *in_RDI;
  char *flags_1;
  string cxx_version;
  string compiler;
  string *cppflags;
  key_type *in_stack_fffffffffffffc28;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffc30;
  allocator *paVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc38;
  char *pcVar5;
  hasher *in_stack_fffffffffffffc40;
  size_type in_stack_fffffffffffffc48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc50;
  iterator in_stack_fffffffffffffc58;
  size_type in_stack_fffffffffffffc60;
  allocator_type *in_stack_fffffffffffffc70;
  char (*in_stack_fffffffffffffc78) [8];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffc80;
  undefined8 **local_368;
  bool local_343;
  allocator local_341;
  string local_340 [38];
  byte local_31a;
  allocator local_319;
  string local_318 [32];
  char *local_2f8;
  string local_2f0 [39];
  allocator local_2c9;
  string local_2c8 [39];
  allocator local_2a1;
  string local_2a0 [37];
  undefined1 local_27b [11];
  undefined8 *local_270 [8];
  undefined1 local_230 [64];
  undefined1 local_1f0 [64];
  undefined1 local_1b0 [64];
  undefined1 local_170 [64];
  undefined1 local_130 [64];
  undefined1 local_f0 [64];
  undefined1 local_b0 [64];
  undefined1 local_70 [64];
  undefined1 **local_30;
  undefined8 local_28;
  undefined1 local_a;
  byte local_9;
  
  local_9 = in_SIL & 1;
  local_a = 0;
  std::__cxx11::string::string((string *)in_RDI);
  if ((local_9 & 1) != 0) {
    std::__cxx11::string::operator+=((string *)in_RDI,"-I../include -I../../include ");
    if ((cxxflags[abi:cxx11](bool)::flags_abi_cxx11_ == '\0') &&
       (iVar1 = __cxa_guard_acquire(&cxxflags[abi:cxx11](bool)::flags_abi_cxx11_), iVar1 != 0)) {
      local_27b._3_8_ = local_270;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[7],_const_char_(&)[11],_true>
                (in_stack_fffffffffffffc80,(char (*) [7])in_stack_fffffffffffffc78,
                 (char (*) [11])in_stack_fffffffffffffc70);
      local_27b._3_8_ = local_230;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[8],_const_char_(&)[11],_true>
                (in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,
                 (char (*) [11])in_stack_fffffffffffffc70);
      local_27b._3_8_ = local_1f0;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[6],_const_char_(&)[11],_true>
                (in_stack_fffffffffffffc80,(char (*) [6])in_stack_fffffffffffffc78,
                 (char (*) [11])in_stack_fffffffffffffc70);
      local_27b._3_8_ = local_1b0;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[7],_const_char_(&)[11],_true>
                (in_stack_fffffffffffffc80,(char (*) [7])in_stack_fffffffffffffc78,
                 (char (*) [11])in_stack_fffffffffffffc70);
      local_27b._3_8_ = local_170;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[8],_const_char_(&)[11],_true>
                (in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,
                 (char (*) [11])in_stack_fffffffffffffc70);
      local_27b._3_8_ = local_130;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[6],_const_char_(&)[11],_true>
                (in_stack_fffffffffffffc80,(char (*) [6])in_stack_fffffffffffffc78,
                 (char (*) [11])in_stack_fffffffffffffc70);
      local_27b._3_8_ = local_f0;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[7],_const_char_(&)[15],_true>
                (in_stack_fffffffffffffc80,(char (*) [7])in_stack_fffffffffffffc78,
                 (char (*) [15])in_stack_fffffffffffffc70);
      local_27b._3_8_ = local_b0;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[8],_const_char_(&)[11],_true>
                (in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,
                 (char (*) [11])in_stack_fffffffffffffc70);
      local_27b._3_8_ = local_70;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[6],_const_char_(&)[11],_true>
                (in_stack_fffffffffffffc80,(char (*) [6])in_stack_fffffffffffffc78,
                 (char (*) [11])in_stack_fffffffffffffc70);
      local_30 = (undefined1 **)local_270;
      local_28 = 9;
      in_stack_fffffffffffffc28 = (key_type *)local_27b;
      std::
      allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::allocator((allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)0x107afc);
      __l._M_len = in_stack_fffffffffffffc60;
      __l._M_array = in_stack_fffffffffffffc58;
      std::
      unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)in_stack_fffffffffffffc50,__l,in_stack_fffffffffffffc48,
                      in_stack_fffffffffffffc40,(key_equal *)in_stack_fffffffffffffc38,
                      in_stack_fffffffffffffc70);
      std::
      allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~allocator((allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)0x107b46);
      local_368 = &local_30;
      do {
        local_368 = local_368 + -8;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~pair(in_stack_fffffffffffffc30);
      } while (local_368 != local_270);
      __cxa_atexit(std::
                   unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::~unordered_map,&cxxflags[abi:cxx11](bool)::flags_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&cxxflags[abi:cxx11](bool)::flags_abi_cxx11_);
    }
    paVar4 = &local_2a1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2a0,"",paVar4);
    std::allocator<char>::~allocator((allocator<char> *)&local_2a1);
    std::__cxx11::string::operator=(local_2a0,"clang");
    paVar4 = &local_2c9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2c8,"",paVar4);
    std::allocator<char>::~allocator((allocator<char> *)&local_2c9);
    std::__cxx11::string::operator=(local_2c8,"14");
    std::operator+(&in_stack_fffffffffffffc58->first,in_stack_fffffffffffffc50);
    pmVar2 = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
    std::__cxx11::string::operator+=((string *)in_RDI,(string *)pmVar2);
    std::__cxx11::string::~string(local_2f0);
    std::__cxx11::string::~string(local_2c8);
    std::__cxx11::string::~string(local_2a0);
  }
  local_2f8 = getenv("CXXFLAGS");
  if (local_2f8 != (char *)0x0) {
    uVar3 = std::__cxx11::string::empty();
    local_31a = 0;
    local_343 = (uVar3 & 1) != 0;
    if (local_343) {
      paVar4 = &local_319;
      pcVar5 = local_2f8;
      std::allocator<char>::allocator();
      local_31a = 1;
      std::__cxx11::string::string(local_318,pcVar5,paVar4);
    }
    else {
      paVar4 = &local_341;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_340," ",paVar4);
      std::operator+(in_stack_fffffffffffffc38,(char *)paVar4);
    }
    local_343 = !local_343;
    std::__cxx11::string::operator+=((string *)in_RDI,local_318);
    std::__cxx11::string::~string(local_318);
    if (local_343) {
      std::__cxx11::string::~string(local_340);
      std::allocator<char>::~allocator((allocator<char> *)&local_341);
    }
    if ((local_31a & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)&local_319);
    }
  }
  return in_RDI;
}

Assistant:

std::string cxxflags(bool internal = false) {
  std::string cppflags;

  if (internal) {
    cppflags += "-I../include -I../../include ";  // bjam, cmake
    static std::unordered_map<std::string, std::string> flags = {
        {"msvc14", "/std:c++14"},     {"clang14", "-std=c++1y"}, {"gcc14", "-std=c++1y"},
        {"msvc17", "/std:c++17"},     {"clang17", "-std=c++1z"}, {"gcc17", "-std=c++1z"},
        {"msvc20", "/std:c++latest"}, {"clang20", "-std=c++2a"}, {"gcc20", "-std=c++2a"}};

    std::string compiler = "";
#if defined(__CLANG__)
    compiler = "clang";
#elif defined(__GCC__)
    compiler = "gcc";
#elif defined(__MSVC__)
    compiler = "msvc";
#endif

    std::string cxx_version = "";
#if __cplusplus <= 201402L
    cxx_version = "14";
#elif __cplusplus == 201703L
    cxx_version = "17";
#elif __cplusplus >= 201704L
    cxx_version = "20";
#endif
    cppflags += flags[compiler + cxx_version];
  }

  if (auto flags = std::getenv("CXXFLAGS")) {
    cppflags += cppflags.empty() ? flags : std::string{" "} + flags;
  }

  return cppflags;
}